

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall c4::yml::Tree::_claim(Tree *this)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  bool bVar7;
  size_t sVar8;
  ulong uVar9;
  size_t sVar10;
  ulong node;
  csubstr cVar11;
  char msg [36];
  char cStack_d4;
  char cStack_d3;
  char cStack_d2;
  char cStack_d1;
  char *pcStack_a0;
  size_t local_98;
  char *pcStack_78;
  size_t local_70;
  char *pcStack_50;
  size_t local_48;
  char *pcStack_28;
  size_t local_20;
  
  if ((this->m_free_head == 0xffffffffffffffff) || (this->m_buf == (NodeData *)0x0)) {
    sVar8 = this->m_cap * 2;
    sVar10 = 0x10;
    if (sVar8 != 0) {
      sVar10 = sVar8;
    }
    reserve(this,sVar10);
    if (this->m_free_head == 0xffffffffffffffff) {
      builtin_strncpy(msg,"check failed: (m_free_head != NO",0x20);
      builtin_strncpy(msg + 0x20,"NE)",4);
      if (((byte)s_error_flags & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar2 = (code *)swi(3);
          sVar8 = (*pcVar2)();
          return sVar8;
        }
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar11 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_20 = cVar11.len;
      pcStack_28 = cVar11.str;
      LVar3.super_LineCol.col = 0;
      LVar3.super_LineCol.offset = SUB168(ZEXT816(0x63aa) << 0x40,0);
      LVar3.super_LineCol.line = SUB168(ZEXT816(0x63aa) << 0x40,8);
      LVar3.name.str = pcStack_28;
      LVar3.name.len = local_20;
      (*p_Var1)(msg,0x24,LVar3,(this->m_callbacks).m_user_data);
    }
  }
  uVar9 = this->m_cap;
  if (uVar9 <= this->m_size) {
    builtin_strncpy(msg,"check failed: (m_size < m_cap)",0x1f);
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar2 = (code *)swi(3);
        sVar8 = (*pcVar2)();
        return sVar8;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar11 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_48 = cVar11.len;
    pcStack_50 = cVar11.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x63ad) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x63ad) << 0x40,8);
    LVar4.name.str = pcStack_50;
    LVar4.name.len = local_48;
    (*p_Var1)(msg,0x1f,LVar4,(this->m_callbacks).m_user_data);
    uVar9 = this->m_cap;
  }
  node = this->m_free_head;
  if (uVar9 <= node) {
    builtin_strncpy(msg,"check failed: (m_free_head >= 0 && m",0x24);
    cStack_d4 = '_';
    cStack_d3 = 'f';
    cStack_d2 = 'r';
    cStack_d1 = 'e';
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar2 = (code *)swi(3);
        sVar8 = (*pcVar2)();
        return sVar8;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar11 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_70 = cVar11.len;
    pcStack_78 = cVar11.str;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x63ae) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x63ae) << 0x40,8);
    LVar5.name.str = pcStack_78;
    LVar5.name.len = local_70;
    (*p_Var1)(msg,0x38,LVar5,(this->m_callbacks).m_user_data);
    node = this->m_free_head;
  }
  sVar10 = this->m_size + 1;
  this->m_size = sVar10;
  sVar8 = this->m_buf[node].m_next_sibling;
  this->m_free_head = sVar8;
  if ((sVar8 == 0xffffffffffffffff) &&
     (this->m_free_tail = 0xffffffffffffffff, sVar10 != this->m_cap)) {
    builtin_strncpy(msg,"check failed: (m_size == m_cap)",0x20);
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar2 = (code *)swi(3);
        sVar8 = (*pcVar2)();
        return sVar8;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar11 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_98 = cVar11.len;
    pcStack_a0 = cVar11.str;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x63b8) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x63b8) << 0x40,8);
    LVar6.name.str = pcStack_a0;
    LVar6.name.len = local_98;
    (*p_Var1)(msg,0x20,LVar6,(this->m_callbacks).m_user_data);
  }
  _clear(this,node);
  return node;
}

Assistant:

size_t Tree::_claim()
{
    if(m_free_head == NONE || m_buf == nullptr)
    {
        size_t sz = 2 * m_cap;
        sz = sz ? sz : 16;
        reserve(sz);
        _RYML_CB_ASSERT(m_callbacks, m_free_head != NONE);
    }

    _RYML_CB_ASSERT(m_callbacks, m_size < m_cap);
    _RYML_CB_ASSERT(m_callbacks, m_free_head >= 0 && m_free_head < m_cap);

    size_t ichild = m_free_head;
    NodeData *child = m_buf + ichild;

    ++m_size;
    m_free_head = child->m_next_sibling;
    if(m_free_head == NONE)
    {
        m_free_tail = NONE;
        _RYML_CB_ASSERT(m_callbacks, m_size == m_cap);
    }

    _clear(ichild);

    return ichild;
}